

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmimedata.cpp
# Opt level: O2

QVariant * __thiscall
QMimeDataPrivate::retrieveTypedData
          (QVariant *__return_storage_ptr__,QMimeDataPrivate *this,QString *format,QMetaType type)

{
  QArrayDataPointer<char> *this_00;
  QObject *pQVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  undefined8 this_01;
  anon_union_24_3_e3d07ef4_for_data *this_02;
  QVariant *this_03;
  long in_FS_OFFSET;
  QByteArrayView text;
  QByteArrayView QVar7;
  QMetaType local_f0;
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  undefined1 *local_c8;
  QMetaType local_c0;
  anon_union_24_3_e3d07ef4_for_data local_b8;
  QMetaType type_local;
  QStringDecoder decoder;
  anon_union_24_3_e3d07ef4_for_data local_58;
  undefined1 *puStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (this->super_QObjectPrivate).super_QObjectData.q_ptr;
  type_local = type;
  iVar3 = QMetaType::registerHelper(&type_local);
  local_58._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  local_58.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
  local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  (*pQVar1->_vptr_QObject[0xe])(&local_58,pQVar1,format,type_local.d_ptr);
  decoder.super_QStringConverter.iface = (Interface *)0xa;
  decoder.super_QStringConverter.state._0_8_ = anon_var_dwarf_70a697;
  bVar2 = ::operator==(format,(QLatin1StringView *)&decoder);
  if ((bVar2) && (puStack_40 < (undefined1 *)0x4)) {
    textUriListLiteral();
    QMetaType::QMetaType(&local_c0,9);
    retrieveTypedData((QVariant *)&decoder,this,(QString *)&local_b8,local_c0);
    ::QVariant::operator=((QVariant *)&local_58,(QVariant *)&decoder);
    ::QVariant::~QVariant((QVariant *)&decoder);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_b8);
    decoder.super_QStringConverter.iface = (Interface *)::QVariant::metaType((QVariant *)&local_58);
    iVar4 = QMetaType::registerHelper((QMetaType *)&decoder);
    if (iVar4 == 0x11) {
      ::QVariant::toUrl((QVariant *)(local_e8 + 0x10));
      QUrl::toDisplayString((QString *)&local_b8,(QUrl *)(local_e8 + 0x10),(FormattingOptions)0x0);
      ::QVariant::QVariant((QVariant *)&decoder,(QString *)&local_b8);
      ::QVariant::operator=((QVariant *)&local_58,(QVariant *)&decoder);
      ::QVariant::~QVariant((QVariant *)&decoder);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_b8);
      QUrl::~QUrl((QUrl *)(local_e8 + 0x10));
    }
    else {
      decoder.super_QStringConverter.iface =
           (Interface *)::QVariant::metaType((QVariant *)&local_58);
      iVar4 = QMetaType::registerHelper((QMetaType *)&decoder);
      if (iVar4 == 9) {
        local_b8._16_8_ = (undefined1 *)0x0;
        local_b8.shared = (PrivateShared *)0x0;
        local_b8._8_8_ = (QVariant *)0x0;
        local_c8 = &DAT_aaaaaaaaaaaaaaaa;
        local_d8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_d8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
        ::QVariant::toList((QVariantList *)(local_e8 + 0x10),(QVariant *)&local_58);
        iVar4 = 0;
        this_03 = (QVariant *)local_d8._8_8_;
        for (lVar6 = (long)local_c8 << 5; lVar6 != 0; lVar6 = lVar6 + -0x20) {
          decoder.super_QStringConverter.iface = (Interface *)::QVariant::metaType(this_03);
          iVar5 = QMetaType::registerHelper((QMetaType *)&decoder);
          if (iVar5 == 0x11) {
            ::QVariant::toUrl((QVariant *)local_e8);
            QUrl::toDisplayString((QString *)&decoder,(QUrl *)local_e8,(FormattingOptions)0x0);
            QString::append((QString *)&local_b8,(QString *)&decoder);
            QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&decoder)
            ;
            QUrl::~QUrl((QUrl *)local_e8);
            QString::append((QString *)&local_b8,(QChar)0xa);
            iVar4 = iVar4 + 1;
          }
          this_03 = this_03 + 1;
        }
        if (iVar4 == 1) {
          QString::chop((QString *)&local_b8,1);
        }
        ::QVariant::QVariant((QVariant *)&decoder,(QString *)&local_b8);
        ::QVariant::operator=((QVariant *)&local_58,(QVariant *)&decoder);
        ::QVariant::~QVariant((QVariant *)&decoder);
        QArrayDataPointer<QVariant>::~QArrayDataPointer
                  ((QArrayDataPointer<QVariant> *)(local_e8 + 0x10));
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_b8);
      }
    }
  }
  decoder.super_QStringConverter.iface = (Interface *)::QVariant::metaType((QVariant *)&local_58);
  bVar2 = ::comparesEqual((QMetaType *)&decoder,&type_local);
  if ((bVar2) || (puStack_40 < (undefined1 *)0x4)) goto switchD_00285f2f_caseD_b;
  if (iVar3 == 9) {
    local_b8.shared = (PrivateShared *)::QVariant::metaType((QVariant *)&local_58);
    iVar4 = QMetaType::registerHelper((QMetaType *)&local_b8.shared);
    if (iVar4 == 0x11) goto switchD_00285f2f_caseD_b;
  }
  else if (iVar3 == 0x11) {
    decoder.super_QStringConverter.iface = (Interface *)::QVariant::metaType((QVariant *)&local_58);
    iVar4 = QMetaType::registerHelper((QMetaType *)&decoder);
    if (iVar4 == 9) goto switchD_00285f2f_caseD_b;
  }
  else if (iVar3 == 0x1006) {
    local_b8.shared = (PrivateShared *)::QVariant::metaType((QVariant *)&local_58);
    iVar4 = QMetaType::registerHelper((QMetaType *)&local_b8.shared);
    if (iVar4 == 0x1001) goto switchD_00285f2f_caseD_b;
  }
  else if (iVar3 == 0x1001) {
    decoder.super_QStringConverter.iface = (Interface *)::QVariant::metaType((QVariant *)&local_58);
    iVar4 = QMetaType::registerHelper((QMetaType *)&decoder);
    if (iVar4 == 0x1006) goto switchD_00285f2f_caseD_b;
  }
  decoder.super_QStringConverter.iface = (Interface *)::QVariant::metaType((QVariant *)&local_58);
  iVar4 = QMetaType::registerHelper((QMetaType *)&decoder);
  if (iVar4 == 0xc) {
    if (iVar3 == 9) {
      decoder.super_QStringConverter.iface = (Interface *)0xd;
      decoder.super_QStringConverter.state._0_8_ = anon_var_dwarf_70a6d0;
      bVar2 = ::operator!=(format,(QLatin1StringView *)&decoder);
      if (!bVar2) {
LAB_0028606f:
        QVar7 = ::QVariant::view<QByteArrayView>((QVariant *)&local_58);
        text.m_data = QVar7.m_data;
        lVar6 = QVar7.m_size;
        if (lVar6 == 0) {
          lVar6 = 0;
        }
        else {
          lVar6 = lVar6 - (ulong)(text.m_data[lVar6 + -1] == '\0');
        }
        text.m_size = lVar6;
        dataToUrls((QList<QVariant> *)&decoder,text);
        ::QVariant::QVariant(__return_storage_ptr__,(QList<QVariant> *)&decoder);
        QArrayDataPointer<QVariant>::~QArrayDataPointer((QArrayDataPointer<QVariant> *)&decoder);
        goto LAB_002862c7;
      }
    }
    else {
      if (iVar3 == 10) {
        local_b8._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_b8.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
        local_b8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
        ::QVariant::toByteArray((QByteArray *)&local_b8,(QVariant *)&local_58);
        bVar2 = QByteArray::isNull((QByteArray *)&local_b8);
        if (bVar2) {
          (__return_storage_ptr__->d).data.shared = (PrivateShared *)0x0;
          *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 8) = 0;
          *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 0x10) = 0;
          *(undefined8 *)&(__return_storage_ptr__->d).field_0x18 = 2;
        }
        else {
          decoder.super_QStringConverter.iface = (Interface *)0x9;
          decoder.super_QStringConverter.state._0_8_ = anon_var_dwarf_70a6ba;
          bVar2 = ::operator==(format,(QLatin1StringView *)&decoder);
          if (bVar2) {
            decoder.super_QStringConverter.state.clearFn = (ClearDataFn)&DAT_aaaaaaaaaaaaaaaa;
            decoder.super_QStringConverter.state.field_4.d[0] = &DAT_aaaaaaaaaaaaaaaa;
            decoder.super_QStringConverter.state.field_4.d[1] = &DAT_aaaaaaaaaaaaaaaa;
            decoder.super_QStringConverter.state.remainingChars = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
            decoder.super_QStringConverter.state.invalidChars = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
            decoder.super_QStringConverter.iface = (Interface *)&DAT_aaaaaaaaaaaaaaaa;
            decoder.super_QStringConverter.state._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
            QVar7.m_data = (storage_type *)local_b8._8_8_;
            QVar7.m_size = local_b8._16_8_;
            QStringDecoder::decoderForHtml(&decoder,QVar7);
            if (decoder.super_QStringConverter.iface != (Interface *)0x0) {
              local_e8._0_8_ = (PrivateShared *)&decoder;
              local_e8._8_8_ = &local_b8;
              QStringDecoder::EncodedData::operator_cast_to_QString
                        ((QString *)(local_e8 + 0x10),(EncodedData *)local_e8);
              ::QVariant::QVariant(__return_storage_ptr__,(QString *)(local_e8 + 0x10));
              QArrayDataPointer<char16_t>::~QArrayDataPointer
                        ((QArrayDataPointer<char16_t> *)(local_e8 + 0x10));
              QStringConverterBase::State::clear(&decoder.super_QStringConverter.state);
              goto LAB_00286338;
            }
            QStringConverterBase::State::clear(&decoder.super_QStringConverter.state);
          }
          QString::fromUtf8<void>((QString *)&decoder,(QByteArray *)&local_b8);
          ::QVariant::QVariant(__return_storage_ptr__,(QString *)&decoder);
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&decoder);
        }
LAB_00286338:
        this_02 = &local_b8;
        goto LAB_0028633d;
      }
      if (iVar3 == 0x11) goto LAB_0028606f;
      if (iVar3 == 0x1003) {
        *(undefined1 **)((long)&(__return_storage_ptr__->d).data + 0x10) = &DAT_aaaaaaaaaaaaaaaa;
        *(undefined1 **)&(__return_storage_ptr__->d).field_0x18 = &DAT_aaaaaaaaaaaaaaaa;
        (__return_storage_ptr__->d).data.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
        *(undefined1 **)((long)&(__return_storage_ptr__->d).data + 8) = &DAT_aaaaaaaaaaaaaaaa;
        ::QVariant::QVariant(__return_storage_ptr__,(QVariant *)&local_58);
        QMetaType::QMetaType(&local_f0,0x1003);
        ::QVariant::convert(__return_storage_ptr__,local_f0);
        goto LAB_002862c7;
      }
    }
    goto switchD_00285f2f_caseD_b;
  }
  if (iVar3 != 0xc) goto switchD_00285f2f_caseD_b;
  decoder.super_QStringConverter.iface = (Interface *)::QVariant::metaType((QVariant *)&local_58);
  iVar3 = QMetaType::registerHelper((QMetaType *)&decoder);
  switch(iVar3) {
  case 9:
    decoder.super_QStringConverter.state.remainingChars = 0;
    decoder.super_QStringConverter.iface = (Interface *)0x0;
    decoder.super_QStringConverter.state.flags.
    super_QFlagsStorageHelper<QStringConverterBase::Flag,_4>.
    super_QFlagsStorage<QStringConverterBase::Flag>.i =
         (QFlagsStorageHelper<QStringConverterBase::Flag,_4>)0x0;
    decoder.super_QStringConverter.state.internalState = 0;
    local_b8._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_b8.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
    local_b8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    ::QVariant::toList((QVariantList *)&local_b8,(QVariant *)&local_58);
    this_00 = (QArrayDataPointer<char> *)(local_e8 + 0x10);
    this_01 = local_b8._8_8_;
    for (lVar6 = local_b8._16_8_ << 5; lVar6 != 0; lVar6 = lVar6 + -0x20) {
      local_d8._0_8_ = ::QVariant::metaType((QVariant *)this_01);
      iVar3 = QMetaType::registerHelper((QMetaType *)this_00);
      if (iVar3 == 0x11) {
        ::QVariant::toUrl((QVariant *)local_e8);
        QUrl::toEncoded((QByteArray *)this_00,(QUrl *)local_e8,(FormattingOptions)0x1f00000);
        QByteArray::append((QByteArray *)&decoder,(QByteArray *)this_00);
        QArrayDataPointer<char>::~QArrayDataPointer(this_00);
        QUrl::~QUrl((QUrl *)local_e8);
        QByteArray::append((QByteArray *)&decoder,"\r\n");
      }
      this_01 = this_01 + 0x20;
    }
    if (decoder.super_QStringConverter.state.remainingChars != 0) {
      ::QVariant::QVariant(__return_storage_ptr__,(QByteArray *)&decoder);
      QArrayDataPointer<QVariant>::~QArrayDataPointer((QArrayDataPointer<QVariant> *)&local_b8);
      goto LAB_0028626d;
    }
    QArrayDataPointer<QVariant>::~QArrayDataPointer((QArrayDataPointer<QVariant> *)&local_b8);
    QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&decoder);
    break;
  case 10:
    ::QVariant::toString((QString *)&local_b8,(QVariant *)&local_58);
    QString::toUtf8_helper((QByteArray *)&decoder,(QString *)&local_b8);
    ::QVariant::QVariant(__return_storage_ptr__,(QByteArray *)&decoder);
    QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&decoder);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_b8);
    goto LAB_002862c7;
  case 0xb:
  case 0xd:
  case 0xe:
  case 0xf:
  case 0x10:
    break;
  case 0xc:
switchD_00285f2f_caseD_c:
    ::QVariant::toByteArray((QByteArray *)&decoder,(QVariant *)&local_58);
    ::QVariant::QVariant(__return_storage_ptr__,(QByteArray *)&decoder);
LAB_0028626d:
    this_02 = (anon_union_24_3_e3d07ef4_for_data *)&decoder;
LAB_0028633d:
    QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)this_02);
    goto LAB_002862c7;
  case 0x11:
    ::QVariant::toUrl((QVariant *)&local_b8);
    QUrl::toEncoded((QByteArray *)&decoder,(QUrl *)&local_b8.shared,(FormattingOptions)0x1f00000);
    ::QVariant::QVariant(__return_storage_ptr__,(QByteArray *)&decoder);
    QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&decoder);
    QUrl::~QUrl((QUrl *)&local_b8.shared);
    goto LAB_002862c7;
  default:
    if (iVar3 == 0x1003) goto switchD_00285f2f_caseD_c;
  }
switchD_00285f2f_caseD_b:
  *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 0x10) = local_58._16_8_;
  *(undefined1 **)&(__return_storage_ptr__->d).field_0x18 = puStack_40;
  (__return_storage_ptr__->d).data.shared = local_58.shared;
  *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 8) = local_58._8_8_;
  local_58.shared = (PrivateShared *)0x0;
  local_58._8_8_ = (undefined1 *)0x0;
  local_58._16_8_ = (undefined1 *)0x0;
  puStack_40 = (undefined1 *)0x2;
LAB_002862c7:
  ::QVariant::~QVariant((QVariant *)&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

QVariant QMimeDataPrivate::retrieveTypedData(const QString &format, QMetaType type) const
{
    Q_Q(const QMimeData);
    int typeId = type.id();

    QVariant data = q->retrieveData(format, type);

    // Text data requested: fallback to URL data if available
    if (format == "text/plain"_L1 && !data.isValid()) {
        data = retrieveTypedData(textUriListLiteral(), QMetaType(QMetaType::QVariantList));
        if (data.metaType().id() == QMetaType::QUrl) {
            data = QVariant(data.toUrl().toDisplayString());
        } else if (data.metaType().id() == QMetaType::QVariantList) {
            QString text;
            int numUrls = 0;
            const QList<QVariant> list = data.toList();
            for (const auto &element : list) {
                if (element.metaType().id() == QMetaType::QUrl) {
                    text += element.toUrl().toDisplayString();
                    text += u'\n';
                    ++numUrls;
                }
            }
            if (numUrls == 1)
                text.chop(1); // no final '\n' if there's only one URL
            data = QVariant(text);
        }
    }

    if (data.metaType() == type || !data.isValid())
        return data;

    // provide more conversion possibilities than just what QVariant provides

    // URLs can be lists as well...
    if ((typeId == QMetaType::QUrl && data.metaType().id() == QMetaType::QVariantList)
        || (typeId == QMetaType::QVariantList && data.metaType().id() == QMetaType::QUrl))
        return data;

    // images and pixmaps are interchangeable
    if ((typeId == QMetaType::QPixmap && data.metaType().id() == QMetaType::QImage)
        || (typeId == QMetaType::QImage && data.metaType().id() == QMetaType::QPixmap))
        return data;

    if (data.metaType().id() == QMetaType::QByteArray) {
        // see if we can convert to the requested type
        switch (typeId) {
        case QMetaType::QString: {
            const QByteArray ba = data.toByteArray();
            if (ba.isNull())
                return QVariant();
            if (format == "text/html"_L1) {
                QStringDecoder decoder = QStringDecoder::decoderForHtml(ba);
                if (decoder.isValid()) {
                    return QString(decoder(ba));
                }
                // fall back to utf8
            }
            return QString::fromUtf8(ba);
        }
        case QMetaType::QColor: {
            QVariant newData = data;
            newData.convert(QMetaType(QMetaType::QColor));
            return newData;
        }
        case QMetaType::QVariantList: {
            if (format != "text/uri-list"_L1)
                break;
            Q_FALLTHROUGH();
        }
        case QMetaType::QUrl: {
            auto bav = data.view<QByteArrayView>();
            // Qt 3.x will send text/uri-list with a trailing
            // null-terminator (that is *not* sent for any other
            // text/* mime-type), so chop it off
            if (bav.endsWith('\0'))
                bav.chop(1);
            return dataToUrls(bav);
        }
        default:
            break;
        }

    } else if (typeId == QMetaType::QByteArray) {

        // try to convert to bytearray
        switch (data.metaType().id()) {
        case QMetaType::QByteArray:
        case QMetaType::QColor:
            return data.toByteArray();
        case QMetaType::QString:
            return data.toString().toUtf8();
        case QMetaType::QUrl:
            return data.toUrl().toEncoded();
        case QMetaType::QVariantList: {
            // has to be list of URLs
            QByteArray result;
            const QList<QVariant> list = data.toList();
            for (const auto &element : list) {
                if (element.metaType().id() == QMetaType::QUrl) {
                    result += element.toUrl().toEncoded();
                    result += "\r\n";
                }
            }
            if (!result.isEmpty())
                return result;
            break;
        }
        default:
            break;
        }
    }
    return data;
}